

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface::load
          (Literal *__return_storage_ptr__,ExternalInterface *this,Load *load,Address addr,
          Name memory)

{
  uint8_t uVar1;
  BasicType BVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  Literal *pLVar6;
  size_t sVar7;
  char *pcVar8;
  float fVar9;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  pcVar8 = memory.super_IString.str._M_str;
  sVar7 = memory.super_IString.str._M_len;
  local_38 = __return_storage_ptr__;
  BVar2 = Type::getBasic(&(load->super_SpecificExpression<(wasm::Expression::Id)12>).
                          super_Expression.type);
  switch(BVar2) {
  case none:
  case unreachable:
    ::wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0xb13);
  case i32:
    uVar1 = load->bytes;
    if (uVar1 == '\x04') {
      uVar4 = (*this->_vptr_ExternalInterface[0x11])(this,addr.addr,sVar7,pcVar8);
    }
    else if (uVar1 == '\x02') {
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0xf])(this,addr.addr,sVar7,pcVar8);
        uVar4 = (uint)(short)iVar3;
      }
      else {
        uVar4 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar7,pcVar8);
        uVar4 = uVar4 & 0xffff;
      }
    }
    else {
      if (uVar1 != '\x01') {
        ::wasm::handle_unreachable
                  ("invalid size",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xae7);
      }
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0xd])(this,addr.addr,sVar7,pcVar8);
        uVar4 = (uint)(char)iVar3;
      }
      else {
        uVar4 = (*this->_vptr_ExternalInterface[0xe])(this,addr.addr,sVar7,pcVar8);
        uVar4 = uVar4 & 0xff;
      }
    }
    *(uint *)&local_38->field_0 = uVar4;
    (local_38->type).id = 2;
    break;
  case i64:
    switch(load->bytes) {
    case '\x01':
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0xd])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)(char)iVar3;
      }
      else {
        uVar4 = (*this->_vptr_ExternalInterface[0xe])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)(uVar4 & 0xff);
      }
      break;
    case '\x02':
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0xf])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)(short)iVar3;
      }
      else {
        uVar4 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)(uVar4 & 0xffff);
      }
      break;
    default:
      ::wasm::handle_unreachable
                ("invalid size",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0xaf9);
    case '\x04':
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0x11])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)iVar3;
      }
      else {
        uVar4 = (*this->_vptr_ExternalInterface[0x12])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)uVar4;
      }
      break;
    case '\b':
      iVar3 = (*this->_vptr_ExternalInterface[0x13])(this,addr.addr,sVar7,pcVar8);
      uVar5 = CONCAT44(extraout_var_01,iVar3);
    }
    (local_38->field_0).i64 = uVar5;
    (local_38->type).id = 3;
    break;
  case f32:
    if (load->bytes == '\x04') {
      local_50.i32 = (*this->_vptr_ExternalInterface[0x12])(this,addr.addr,sVar7,pcVar8);
      pLVar6 = local_38;
      local_40 = 2;
      ::wasm::Literal::castToF32();
    }
    else {
      if (load->bytes != '\x02') {
        ::wasm::handle_unreachable
                  ("invalid size",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xb09);
      }
      uVar4 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar7,pcVar8);
      pLVar6 = local_38;
      if (uVar4 << 0x11 < 0x8000000) {
        fVar9 = (float)(uVar4 & 0x7fff | 0x3f000000) + -0.5;
      }
      else {
        fVar9 = (float)((uVar4 << 0x11) >> 4 | 0x70000000) * 1.92593e-34;
      }
      local_50.i32 = (int)(short)uVar4 & 0x80000000U | (uint)fVar9;
      local_40 = 2;
      ::wasm::Literal::castToF32();
    }
    goto LAB_001be2d6;
  case f64:
    iVar3 = (*this->_vptr_ExternalInterface[0x14])(this,addr.addr,sVar7,pcVar8);
    pLVar6 = local_38;
    local_50.i64 = CONCAT44(extraout_var_00,iVar3);
    local_40 = 3;
    ::wasm::Literal::castToF64();
LAB_001be2d6:
    ::wasm::Literal::~Literal((Literal *)&local_50.func);
    local_38 = pLVar6;
    break;
  case v128:
    iVar3 = (*this->_vptr_ExternalInterface[0x15])
                      (this,addr.addr,(load->memory).super_IString.str._M_len,
                       (load->memory).super_IString.str._M_str);
    pLVar6 = local_38;
    local_50.i64 = CONCAT44(extraout_var,iVar3);
    ::wasm::Literal::Literal(local_38,local_50.v128);
    local_38 = pLVar6;
    break;
  default:
    ::wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0xb15);
  }
  return local_38;
}

Assistant:

virtual Literal load(Load* load, Address addr, Name memory) {
      switch (load->type.getBasic()) {
        case Type::i32: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int32_t)load8s(addr, memory))
                                   : Literal((int32_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int32_t)load16s(addr, memory))
                                   : Literal((int32_t)load16u(addr, memory));
            case 4:
              return Literal((int32_t)load32s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::i64: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int64_t)load8s(addr, memory))
                                   : Literal((int64_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int64_t)load16s(addr, memory))
                                   : Literal((int64_t)load16u(addr, memory));
            case 4:
              return load->signed_ ? Literal((int64_t)load32s(addr, memory))
                                   : Literal((int64_t)load32u(addr, memory));
            case 8:
              return Literal((int64_t)load64s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::f32: {
          switch (load->bytes) {
            case 2: {
              // Convert the float16 to float32 and store the binary
              // representation.
              return Literal(bit_cast<int32_t>(
                               fp16_ieee_to_fp32_value(load16u(addr, memory))))
                .castToF32();
            }
            case 4:
              return Literal(load32u(addr, memory)).castToF32();
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::f64:
          return Literal(load64u(addr, memory)).castToF64();
        case Type::v128:
          return Literal(load128(addr, load->memory).data());
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      WASM_UNREACHABLE("invalid type");
    }